

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

int outformatlen(char *s,uint slen)

{
  runsdef *prVar1;
  objnum oVar2;
  runcxdef *ctx;
  int iVar3;
  runsdef *prVar4;
  runsdef val;
  runsdef local_38;
  
  oVar2 = G_user_filter;
  if (G_user_filter != 0xffff) {
    runpstr(runctx,s,slen,1);
    runfn(runctx,G_user_filter,1);
    ctx = runctx;
    prVar1 = runctx->runcxsp;
    if (prVar1[-1].runstyp == '\x03') {
      prVar4 = prVar1 + -1;
      runctx->runcxsp = prVar4;
      local_38.runstyp = prVar4->runstyp;
      local_38._1_7_ = *(undefined7 *)&prVar4->field_0x1;
      local_38.runsv = (anon_union_8_4_1dda36f5_for_runsv)prVar1[-1].runsv.runsvstr;
      slen = *(ushort *)local_38.runsv.runsvstr - 2;
      s = (char *)(local_38.runsv.runsvnum + 2);
      runrepush(ctx,&local_38);
    }
  }
  if ((slen != 0) && ((char)*(ushort *)s != '\0')) {
    outcnt = 1;
  }
  iVar3 = out_is_hidden();
  if ((iVar3 == 0) && (outwxflag == '\0')) {
    outformatlen_stream(&G_std_disp,s,(ulong)slen);
    if (logfp != (osfildef *)0x0) {
      outformatlen_stream(&G_log_disp,s,(ulong)slen);
      fflush((FILE *)logfp);
    }
  }
  if (oVar2 != 0xffff) {
    runctx->runcxsp = runctx->runcxsp + -1;
  }
  return 0;
}

Assistant:

int outformatlen(char *s, uint slen)
{
    char     c;
    uint     orig_slen;
    char    *orig_s;
    int      ret;
    int      called_filter;

    /* presume we'll return success */
    ret = 0;

    /* presume we won't call the filter function */
    called_filter = FALSE;

    /* if there's a user filter function to invoke, call it */
    if (G_user_filter != MCMONINV)
    {
        /* push the string */
        runpstr(runctx, s, slen, 1);

        /* call the filter */
        runfn(runctx, G_user_filter, 1);

        /* 
         *   note that we called the filter, so that we'll remove the
         *   result of the filter from the stack before we return 
         */
        called_filter = TRUE;

        /* if the result is a string, use it in place of the original text */
        if (runtostyp(runctx) == DAT_SSTRING)
        {
            runsdef val;
            uchar *p;

            /* pop the value */
            runpop(runctx, &val);

            /* 
             *   get the text from the string, and use it as a replacement
             *   for the original string 
             */
            p = val.runsv.runsvstr;
            slen = osrp2(p) - 2;
            s = (char *)(p + 2);

            /* 
             *   push the string back onto the stack - this will ensure
             *   that the string stays referenced while we're working, so
             *   that the garbage collector won't delete it 
             */
            runrepush(runctx, &val);
        }
    }

    /* remember the original string, before we scan the first character */
    orig_s = s;
    orig_slen = slen;

    /* get the first character to display */
    c = nextout(&s, &slen);

    /* if the string is non-empty, note that we've displayed something */
    if (c != 0)
        outcnt = 1;

    /* check to see if we're hiding output */
    if (out_is_hidden())
        goto done;

    /* if the debugger is showing watchpoints, suppress all output */
    if (outwxflag)
        goto done;

    /* display the string */
    ret = outformatlen_stream(&G_std_disp, orig_s, orig_slen);

    /* if there's a log file, write to the log file as well */
    if (logfp != 0)
    {
        outformatlen_stream(&G_log_disp, orig_s, orig_slen);
        osfflush(logfp);
    }

done:
    /* if we called the filter, remove the result from the stack */
    if (called_filter)
        rundisc(runctx);

    /* return the result from displaying to the screen */
    return ret;
}